

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

OptionStatus
getOptionIndex(HighsLogOptions *report_log_options,string *name,
              vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
              HighsInt *index)

{
  pointer ppOVar1;
  pointer ppOVar2;
  pointer __s2;
  size_t __n;
  OptionRecord *pOVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  
  ppOVar1 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppOVar2 = (option_records->super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  *index = 0;
  uVar6 = (uint)((ulong)((long)ppOVar2 - (long)ppOVar1) >> 3);
  if (0 < (int)uVar6) {
    __s2 = (name->_M_dataplus)._M_p;
    __n = name->_M_string_length;
    uVar5 = 0;
    do {
      pOVar3 = ppOVar1[uVar5];
      if ((pOVar3->name)._M_string_length == __n) {
        if (__n == 0) {
          return kOk;
        }
        iVar4 = bcmp((pOVar3->name)._M_dataplus._M_p,__s2,__n);
        if (iVar4 == 0) {
          return kOk;
        }
      }
      uVar5 = uVar5 + 1;
      *index = (HighsInt)uVar5;
    } while ((uVar6 & 0x7fffffff) != uVar5);
  }
  highsLogUser(report_log_options,kError,"getOptionIndex: Option \"%s\" is unknown\n",
               (name->_M_dataplus)._M_p);
  return kUnknownOption;
}

Assistant:

OptionStatus getOptionIndex(const HighsLogOptions& report_log_options,
                            const std::string& name,
                            const std::vector<OptionRecord*>& option_records,
                            HighsInt& index) {
  HighsInt num_options = option_records.size();
  for (index = 0; index < num_options; index++)
    if (option_records[index]->name == name) return OptionStatus::kOk;
  highsLogUser(report_log_options, HighsLogType::kError,
               "getOptionIndex: Option \"%s\" is unknown\n", name.c_str());
  return OptionStatus::kUnknownOption;
}